

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__YCbCr_to_RGB_simd(stbi_uc *out,stbi_uc *y,stbi_uc *pcb,stbi_uc *pcr,int count,int step)

{
  char cVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkbyte10 Var29;
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte9 Var32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined6 uVar39;
  undefined4 uVar40;
  undefined2 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  stbi_uc *psVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined2 uVar53;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar73;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar74 [16];
  ushort uVar87;
  undefined1 auVar88 [16];
  undefined4 uVar54;
  undefined6 uVar55;
  undefined8 uVar56;
  undefined1 auVar57 [12];
  undefined1 auVar58 [14];
  undefined1 auVar61 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  
  auVar46 = _DAT_00173b50;
  auVar45 = _DAT_00173b40;
  auVar44 = _DAT_00173b30;
  auVar43 = _DAT_00173b20;
  auVar42 = _DAT_00173b10;
  lVar49 = 0;
  if (step == 4) {
    for (; lVar49 + 7 < (long)count; lVar49 = lVar49 + 8) {
      uVar56 = *(undefined8 *)(y + lVar49);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)(pcr + lVar49);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)(pcb + lVar49);
      auVar80._0_14_ = auVar42._0_14_;
      auVar80[0xe] = auVar42[7];
      auVar80[0xf] = (char)((ulong)uVar56 >> 0x38);
      auVar79._14_2_ = auVar80._14_2_;
      auVar79._0_13_ = auVar42._0_13_;
      auVar79[0xd] = (char)((ulong)uVar56 >> 0x30);
      auVar78._13_3_ = auVar79._13_3_;
      auVar78._0_12_ = auVar42._0_12_;
      auVar78[0xc] = auVar42[6];
      auVar77._12_4_ = auVar78._12_4_;
      auVar77._0_11_ = auVar42._0_11_;
      auVar77[0xb] = (char)((ulong)uVar56 >> 0x28);
      auVar76._11_5_ = auVar77._11_5_;
      auVar76._0_10_ = auVar42._0_10_;
      auVar76[10] = auVar42[5];
      auVar75._10_6_ = auVar76._10_6_;
      auVar75._0_9_ = auVar42._0_9_;
      auVar75[9] = (char)((ulong)uVar56 >> 0x20);
      auVar74._9_7_ = auVar75._9_7_;
      auVar74._0_8_ = auVar42._0_8_;
      auVar74[8] = auVar42[4];
      Var29 = CONCAT91(CONCAT81(auVar74._8_8_,(char)((ulong)uVar56 >> 0x18)),auVar42[3]);
      auVar28._2_10_ = Var29;
      auVar28[1] = (char)((ulong)uVar56 >> 0x10);
      auVar28[0] = auVar42[2];
      auVar27._2_12_ = auVar28;
      auVar27[1] = (char)((ulong)uVar56 >> 8);
      auVar27[0] = auVar42[1];
      auVar62 = auVar62 ^ auVar42;
      auVar33[10] = 0;
      auVar33._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar33[0xb] = auVar62[5];
      auVar35[9] = auVar62[4];
      auVar35._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar35._10_2_ = auVar33._10_2_;
      auVar37._9_3_ = auVar35._9_3_;
      auVar37._0_9_ = (unkuint9)0;
      auVar67._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar37._8_4_,auVar62[3])) << 0x38,6);
      auVar67[0] = auVar62[2];
      auVar67._11_5_ = 0;
      auVar59._1_12_ = SUB1612(auVar67 << 0x28,4);
      auVar59[0] = auVar62[1];
      auVar59._13_3_ = 0;
      auVar88._1_14_ = SUB1614(auVar59 << 0x18,2);
      auVar88[0] = auVar62[0];
      auVar88[0xf] = 0;
      auVar66 = auVar66 ^ auVar42;
      auVar34[10] = 0;
      auVar34._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar34[0xb] = auVar66[5];
      auVar36[9] = auVar66[4];
      auVar36._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar36._10_2_ = auVar34._10_2_;
      auVar38._9_3_ = auVar36._9_3_;
      auVar38._0_9_ = (unkuint9)0;
      auVar26._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar38._8_4_,auVar66[3])) << 0x38,6);
      auVar26[0] = auVar66[2];
      auVar26._11_5_ = 0;
      auVar25._1_12_ = SUB1612(auVar26 << 0x28,4);
      auVar25[0] = auVar66[1];
      auVar25._13_3_ = 0;
      auVar63._1_14_ = SUB1614(auVar25 << 0x18,2);
      auVar63[0] = auVar66[0];
      auVar63[0xf] = 0;
      uVar73 = CONCAT11((char)uVar56,auVar42[0]) >> 4;
      uVar81 = auVar27._0_2_ >> 4;
      uVar82 = auVar28._0_2_ >> 4;
      uVar83 = (ushort)Var29 >> 4;
      uVar84 = auVar74._8_2_ >> 4;
      uVar85 = auVar76._10_2_ >> 4;
      uVar86 = auVar78._12_2_ >> 4;
      uVar87 = auVar79._14_2_ >> 4;
      auVar59 = pmulhw(auVar88 << 8,auVar43);
      auVar67 = pmulhw(auVar63 << 8,auVar44);
      auVar63 = pmulhw(auVar63 << 8,auVar45);
      auVar88 = pmulhw(auVar88 << 8,auVar46);
      auVar60._0_2_ = auVar59._0_2_ + uVar73;
      auVar60._2_2_ = auVar59._2_2_ + uVar81;
      auVar60._4_2_ = auVar59._4_2_ + uVar82;
      auVar60._6_2_ = auVar59._6_2_ + uVar83;
      auVar60._8_2_ = auVar59._8_2_ + uVar84;
      auVar60._10_2_ = auVar59._10_2_ + uVar85;
      auVar60._12_2_ = auVar59._12_2_ + uVar86;
      auVar60._14_2_ = auVar59._14_2_ + uVar87;
      auVar68._0_2_ = auVar67._0_2_ + uVar73 + auVar88._0_2_;
      auVar68._2_2_ = auVar67._2_2_ + uVar81 + auVar88._2_2_;
      auVar68._4_2_ = auVar67._4_2_ + uVar82 + auVar88._4_2_;
      auVar68._6_2_ = auVar67._6_2_ + uVar83 + auVar88._6_2_;
      auVar68._8_2_ = auVar67._8_2_ + uVar84 + auVar88._8_2_;
      auVar68._10_2_ = auVar67._10_2_ + uVar85 + auVar88._10_2_;
      auVar68._12_2_ = auVar67._12_2_ + uVar86 + auVar88._12_2_;
      auVar68._14_2_ = auVar67._14_2_ + uVar87 + auVar88._14_2_;
      auVar64._0_2_ = auVar63._0_2_ + uVar73;
      auVar64._2_2_ = auVar63._2_2_ + uVar81;
      auVar64._4_2_ = auVar63._4_2_ + uVar82;
      auVar64._6_2_ = auVar63._6_2_ + uVar83;
      auVar64._8_2_ = auVar63._8_2_ + uVar84;
      auVar64._10_2_ = auVar63._10_2_ + uVar85;
      auVar64._12_2_ = auVar63._12_2_ + uVar86;
      auVar64._14_2_ = auVar63._14_2_ + uVar87;
      auVar88 = psraw(auVar60,4);
      auVar63 = psraw(auVar64,4);
      sVar2 = auVar88._0_2_;
      sVar3 = auVar88._2_2_;
      sVar5 = auVar88._4_2_;
      sVar7 = auVar88._6_2_;
      sVar9 = auVar88._8_2_;
      sVar11 = auVar88._10_2_;
      sVar13 = auVar88._12_2_;
      sVar15 = auVar88._14_2_;
      cVar1 = (0 < sVar15) * (sVar15 < 0x100) * auVar88[0xe] - (0xff < sVar15);
      sVar17 = auVar63._0_2_;
      sVar18 = auVar63._2_2_;
      sVar19 = auVar63._4_2_;
      sVar20 = auVar63._6_2_;
      sVar21 = auVar63._8_2_;
      sVar22 = auVar63._10_2_;
      sVar23 = auVar63._12_2_;
      sVar24 = auVar63._14_2_;
      auVar59 = psraw(auVar68,4);
      sVar15 = auVar59._0_2_;
      sVar4 = auVar59._2_2_;
      sVar6 = auVar59._4_2_;
      sVar8 = auVar59._6_2_;
      sVar10 = auVar59._8_2_;
      sVar12 = auVar59._10_2_;
      sVar14 = auVar59._12_2_;
      sVar16 = auVar59._14_2_;
      uVar41 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar59[0xe] - (0xff < sVar16),cVar1);
      uVar40 = CONCAT31(CONCAT21(uVar41,(0 < sVar14) * (sVar14 < 0x100) * auVar59[0xc] -
                                        (0xff < sVar14)),
                        (0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] - (0xff < sVar13));
      uVar39 = CONCAT51(CONCAT41(uVar40,(0 < sVar12) * (sVar12 < 0x100) * auVar59[10] -
                                        (0xff < sVar12)),
                        (0 < sVar11) * (sVar11 < 0x100) * auVar88[10] - (0xff < sVar11));
      Var32 = CONCAT72(CONCAT61(uVar39,(0 < sVar10) * (sVar10 < 0x100) * auVar59[8] -
                                       (0xff < sVar10)),
                       CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar88[8] - (0xff < sVar9),cVar1));
      Var29 = CONCAT91(CONCAT81((long)((unkuint9)Var32 >> 8),
                                (0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8)),
                       (0 < sVar7) * (sVar7 < 0x100) * auVar88[6] - (0xff < sVar7));
      auVar31._2_10_ = Var29;
      auVar31[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar59[4] - (0xff < sVar6);
      auVar31[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar88[4] - (0xff < sVar5);
      auVar30._2_12_ = auVar31;
      auVar30[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar59[2] - (0xff < sVar4);
      auVar30[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar88[2] - (0xff < sVar3);
      auVar65._0_2_ =
           CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar59[0] - (0xff < sVar15),
                    (0 < sVar2) * (sVar2 < 0x100) * auVar88[0] - (0xff < sVar2));
      auVar65._2_14_ = auVar30;
      uVar53 = CONCAT11(0xff,(0 < sVar17) * (sVar17 < 0x100) * auVar63[0] - (0xff < sVar17));
      uVar54 = CONCAT13(0xff,CONCAT12((0 < sVar18) * (sVar18 < 0x100) * auVar63[2] - (0xff < sVar18)
                                      ,uVar53));
      uVar55 = CONCAT15(0xff,CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar63[4] - (0xff < sVar19)
                                      ,uVar54));
      uVar56 = CONCAT17(0xff,CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar63[6] - (0xff < sVar20)
                                      ,uVar55));
      auVar57._0_10_ =
           CONCAT19(0xff,CONCAT18((0 < sVar21) * (sVar21 < 0x100) * auVar63[8] - (0xff < sVar21),
                                  uVar56));
      auVar57[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar63[10] - (0xff < sVar22);
      auVar57[0xb] = 0xff;
      auVar58[0xc] = (0 < sVar23) * (sVar23 < 0x100) * auVar63[0xc] - (0xff < sVar23);
      auVar58._0_12_ = auVar57;
      auVar58[0xd] = 0xff;
      auVar61[0xe] = (0 < sVar24) * (sVar24 < 0x100) * auVar63[0xe] - (0xff < sVar24);
      auVar61._0_14_ = auVar58;
      auVar61[0xf] = 0xff;
      auVar72._0_12_ = auVar65._0_12_;
      auVar72._12_2_ = (short)Var29;
      auVar72._14_2_ = (short)((ulong)uVar56 >> 0x30);
      auVar71._12_4_ = auVar72._12_4_;
      auVar71._0_10_ = auVar65._0_10_;
      auVar71._10_2_ = (short)((uint6)uVar55 >> 0x20);
      auVar70._10_6_ = auVar71._10_6_;
      auVar70._0_8_ = auVar65._0_8_;
      auVar70._8_2_ = auVar31._0_2_;
      auVar69._8_8_ = auVar70._8_8_;
      auVar69._6_2_ = (short)((uint)uVar54 >> 0x10);
      auVar69._4_2_ = auVar30._0_2_;
      auVar69._2_2_ = uVar53;
      auVar69._0_2_ = auVar65._0_2_;
      *(undefined1 (*) [16])out = auVar69;
      *(short *)*(undefined1 (*) [16])((long)out + 0x10) = (short)((unkuint9)Var32 >> 8);
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 2) =
           (short)((unkuint10)auVar57._0_10_ >> 0x40);
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 4) = (short)uVar39;
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 6) = auVar57._10_2_;
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 8) = (short)uVar40;
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 10) = auVar58._12_2_;
      *(undefined2 *)(*(undefined1 (*) [16])((long)out + 0x10) + 0xc) = uVar41;
      *(short *)(*(undefined1 (*) [16])((long)out + 0x10) + 0xe) = auVar61._14_2_;
      out = (stbi_uc *)((long)out + 0x20);
    }
  }
  psVar48 = *(undefined1 (*) [16])out + 3;
  for (; lVar49 < count; lVar49 = lVar49 + 1) {
    iVar50 = (uint)y[lVar49] * 0x100000;
    iVar51 = (int)((pcr[lVar49] - 0x80) * 0x166f00 + iVar50 + 0x80000) >> 0x14;
    if (iVar51 < 1) {
      iVar51 = 0;
    }
    if (0xfe < iVar51) {
      iVar51 = 0xff;
    }
    iVar52 = ((pcb[lVar49] - 0x80) * -0x58200 & 0xffff0000) +
             (pcr[lVar49] - 0x80) * -0xb6d00 + iVar50 + 0x80000;
    if (iVar52 >> 0x14 < 1) {
      iVar52 = 0;
    }
    iVar52 = iVar52 >> 0x14;
    if (0xfe < iVar52) {
      iVar52 = 0xff;
    }
    iVar47 = (int)(iVar50 + (pcb[lVar49] - 0x80) * 0x1c5a00 + 0x80000) >> 0x14;
    iVar50 = 0;
    if (0 < iVar47) {
      iVar50 = iVar47;
    }
    if (0xfe < iVar50) {
      iVar50 = 0xff;
    }
    psVar48[-3] = (stbi_uc)iVar51;
    psVar48[-2] = (stbi_uc)iVar52;
    psVar48[-1] = (stbi_uc)iVar50;
    *psVar48 = 0xff;
    psVar48 = psVar48 + step;
  }
  return;
}

Assistant:

static void stbi__YCbCr_to_RGB_simd(stbi_uc *out, stbi_uc const *y, stbi_uc const *pcb, stbi_uc const *pcr, int count, int step) {
  int i = 0;

#ifdef STBI_SSE2
  // step == 3 is pretty ugly on the final interleave, and i'm not convinced
  // it's useful in practice (you wouldn't use it for textures, for example).
  // so just accelerate step == 4 case.
  if (step == 4) {
    // this is a fairly straightforward implementation and not super-optimized.
    __m128i signflip = _mm_set1_epi8(-0x80);
    __m128i cr_const0 = _mm_set1_epi16((short)(1.40200f * 4096.0f + 0.5f));
    __m128i cr_const1 = _mm_set1_epi16(-(short)(0.71414f * 4096.0f + 0.5f));
    __m128i cb_const0 = _mm_set1_epi16(-(short)(0.34414f * 4096.0f + 0.5f));
    __m128i cb_const1 = _mm_set1_epi16((short)(1.77200f * 4096.0f + 0.5f));
    __m128i y_bias = _mm_set1_epi8((char)(unsigned char)128);
    __m128i xw = _mm_set1_epi16(255); // alpha channel

    for (; i + 7 < count; i += 8) {
      // load
      __m128i y_bytes = _mm_loadl_epi64((__m128i *)(y + i));
      __m128i cr_bytes = _mm_loadl_epi64((__m128i *)(pcr + i));
      __m128i cb_bytes = _mm_loadl_epi64((__m128i *)(pcb + i));
      __m128i cr_biased = _mm_xor_si128(cr_bytes, signflip); // -128
      __m128i cb_biased = _mm_xor_si128(cb_bytes, signflip); // -128

      // unpack to short (and left-shift cr, cb by 8)
      __m128i yw = _mm_unpacklo_epi8(y_bias, y_bytes);
      __m128i crw = _mm_unpacklo_epi8(_mm_setzero_si128(), cr_biased);
      __m128i cbw = _mm_unpacklo_epi8(_mm_setzero_si128(), cb_biased);

      // color transform
      __m128i yws = _mm_srli_epi16(yw, 4);
      __m128i cr0 = _mm_mulhi_epi16(cr_const0, crw);
      __m128i cb0 = _mm_mulhi_epi16(cb_const0, cbw);
      __m128i cb1 = _mm_mulhi_epi16(cbw, cb_const1);
      __m128i cr1 = _mm_mulhi_epi16(crw, cr_const1);
      __m128i rws = _mm_add_epi16(cr0, yws);
      __m128i gwt = _mm_add_epi16(cb0, yws);
      __m128i bws = _mm_add_epi16(yws, cb1);
      __m128i gws = _mm_add_epi16(gwt, cr1);

      // descale
      __m128i rw = _mm_srai_epi16(rws, 4);
      __m128i bw = _mm_srai_epi16(bws, 4);
      __m128i gw = _mm_srai_epi16(gws, 4);

      // back to byte, set up for transpose
      __m128i brb = _mm_packus_epi16(rw, bw);
      __m128i gxb = _mm_packus_epi16(gw, xw);

      // transpose to interleave channels
      __m128i t0 = _mm_unpacklo_epi8(brb, gxb);
      __m128i t1 = _mm_unpackhi_epi8(brb, gxb);
      __m128i o0 = _mm_unpacklo_epi16(t0, t1);
      __m128i o1 = _mm_unpackhi_epi16(t0, t1);

      // store
      _mm_storeu_si128((__m128i *)(out + 0), o0);
      _mm_storeu_si128((__m128i *)(out + 16), o1);
      out += 32;
    }
  }
#endif

#ifdef STBI_NEON
  // in this version, step=3 support would be easy to add. but is there demand?
  if (step == 4) {
    // this is a fairly straightforward implementation and not super-optimized.
    uint8x8_t signflip = vdup_n_u8(0x80);
    int16x8_t cr_const0 = vdupq_n_s16((short)(1.40200f * 4096.0f + 0.5f));
    int16x8_t cr_const1 = vdupq_n_s16(-(short)(0.71414f * 4096.0f + 0.5f));
    int16x8_t cb_const0 = vdupq_n_s16(-(short)(0.34414f * 4096.0f + 0.5f));
    int16x8_t cb_const1 = vdupq_n_s16((short)(1.77200f * 4096.0f + 0.5f));

    for (; i + 7 < count; i += 8) {
      // load
      uint8x8_t y_bytes = vld1_u8(y + i);
      uint8x8_t cr_bytes = vld1_u8(pcr + i);
      uint8x8_t cb_bytes = vld1_u8(pcb + i);
      int8x8_t cr_biased = vreinterpret_s8_u8(vsub_u8(cr_bytes, signflip));
      int8x8_t cb_biased = vreinterpret_s8_u8(vsub_u8(cb_bytes, signflip));

      // expand to s16
      int16x8_t yws = vreinterpretq_s16_u16(vshll_n_u8(y_bytes, 4));
      int16x8_t crw = vshll_n_s8(cr_biased, 7);
      int16x8_t cbw = vshll_n_s8(cb_biased, 7);

      // color transform
      int16x8_t cr0 = vqdmulhq_s16(crw, cr_const0);
      int16x8_t cb0 = vqdmulhq_s16(cbw, cb_const0);
      int16x8_t cr1 = vqdmulhq_s16(crw, cr_const1);
      int16x8_t cb1 = vqdmulhq_s16(cbw, cb_const1);
      int16x8_t rws = vaddq_s16(yws, cr0);
      int16x8_t gws = vaddq_s16(vaddq_s16(yws, cb0), cr1);
      int16x8_t bws = vaddq_s16(yws, cb1);

      // undo scaling, round, convert to byte
      uint8x8x4_t o;
      o.val[0] = vqrshrun_n_s16(rws, 4);
      o.val[1] = vqrshrun_n_s16(gws, 4);
      o.val[2] = vqrshrun_n_s16(bws, 4);
      o.val[3] = vdup_n_u8(255);

      // store, interleaving r/g/b/a
      vst4_u8(out, o);
      out += 8 * 4;
    }
  }
#endif

  for (; i < count; ++i) {
    int y_fixed = (y[i] << 20) + (1 << 19); // rounding
    int r, g, b;
    int cr = pcr[i] - 128;
    int cb = pcb[i] - 128;
    r = y_fixed + cr * stbi__float2fixed(1.40200f);
    g = y_fixed + cr * -stbi__float2fixed(0.71414f) + ((cb * -stbi__float2fixed(0.34414f)) & 0xffff0000);
    b = y_fixed + cb * stbi__float2fixed(1.77200f);
    r >>= 20;
    g >>= 20;
    b >>= 20;
    if ((unsigned)r > 255) {
      if (r < 0)
        r = 0;
      else
        r = 255;
    }
    if ((unsigned)g > 255) {
      if (g < 0)
        g = 0;
      else
        g = 255;
    }
    if ((unsigned)b > 255) {
      if (b < 0)
        b = 0;
      else
        b = 255;
    }
    out[0] = (stbi_uc)r;
    out[1] = (stbi_uc)g;
    out[2] = (stbi_uc)b;
    out[3] = 255;
    out += step;
  }
}